

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9StreamReadWholeFile(void *pHandle,jx9_io_stream *pStream,SyBlob *pOut)

{
  sxi32 sVar1;
  jx9_int64 jVar2;
  char zBuf [8192];
  undefined1 auStack_2028 [8200];
  
  do {
    jVar2 = (*pStream->xRead)(pHandle,auStack_2028,0x2000);
    if (jVar2 < 1) break;
    sVar1 = SyBlobAppend(pOut,auStack_2028,(sxu32)jVar2);
  } while (sVar1 == 0);
  return -(uint)(pOut->nByte == 0);
}

Assistant:

JX9_PRIVATE sxi32 jx9StreamReadWholeFile(void *pHandle, const jx9_io_stream *pStream, SyBlob *pOut)
{
	jx9_int64 nRead;
	char zBuf[8192]; /* 8K */
	int rc;
	/* Perform the requested operation */
	for(;;){
		nRead = pStream->xRead(pHandle, zBuf, sizeof(zBuf));
		if( nRead < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Append contents */
		rc = SyBlobAppend(pOut, zBuf, (sxu32)nRead);
		if( rc != SXRET_OK ){
			break;
		}
	}
	return SyBlobLength(pOut) > 0 ? SXRET_OK : -1;
}